

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O2

string * to_string_abi_cxx11_(ze_native_kernel_uuid_t uuid)

{
  ostream *poVar1;
  string *in_RDI;
  int i;
  long lVar2;
  ostringstream result;
  char local_1b0 [16];
  ostringstream local_1a0 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 0x10));
  std::operator<<((ostream *)(local_1b0 + 0x10),"{");
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    poVar1 = std::operator<<((ostream *)(local_1b0 + 0x10),"0x");
    *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
         *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar1 = std::operator<<(poVar1,local_1b0[lVar2]);
    std::operator<<(poVar1,",");
  }
  std::operator<<((ostream *)(local_1b0 + 0x10),"\b}");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 0x10));
  return in_RDI;
}

Assistant:

std::string to_string(const ze_native_kernel_uuid_t uuid) {
  std::ostringstream result;
  result << "{";
  for (int i = 0; i < ZE_MAX_NATIVE_KERNEL_UUID_SIZE; i++) {
    result << "0x" << std::hex << uuid.id[i] << ",";
  }
  result << "\b}";
  return result.str();
}